

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::CaptureNamedGroups(void)

{
  _Rb_tree_color _Var1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this;
  const_iterator cVar4;
  RE2 re;
  undefined1 local_278 [16];
  undefined1 *local_268 [46];
  RE2 local_f8;
  
  RE2::RE2(&local_f8,"(hello world)");
  iVar2 = RE2::NumberOfCapturingGroups(&local_f8);
  if (iVar2 != 1) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x213,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (re.NumberOfCapturingGroups()) == (1)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  pmVar3 = RE2::NamedCapturingGroups_abi_cxx11_(&local_f8);
  if ((pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x215,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (m.size()) == (0)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  RE2::~RE2(&local_f8);
  RE2::RE2(&local_f8,"(?P<A>expr(?P<B>expr)(?P<C>expr))((expr)(?P<D>expr))");
  iVar2 = RE2::NumberOfCapturingGroups(&local_f8);
  if (iVar2 != 6) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (re.NumberOfCapturingGroups()) == (6)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  this = &RE2::NamedCapturingGroups_abi_cxx11_(&local_f8)->_M_t;
  if ((this->_M_impl).super__Rb_tree_header._M_node_count != 4) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (m.size()) == (4)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"A","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_278);
  _Var1 = cVar4._M_node[2]._M_color;
  if ((undefined1 **)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_);
  }
  if (_Var1 != _S_black) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (m.find(\"A\")->second) == (1)",0x2a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"B","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_278);
  _Var1 = cVar4._M_node[2]._M_color;
  if ((undefined1 **)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_);
  }
  if (_Var1 != 2) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (m.find(\"B\")->second) == (2)",0x2a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"C","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_278);
  _Var1 = cVar4._M_node[2]._M_color;
  if ((undefined1 **)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_);
  }
  if (_Var1 != 3) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (m.find(\"C\")->second) == (3)",0x2a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"D","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_278);
  _Var1 = cVar4._M_node[2]._M_color;
  if ((undefined1 **)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_);
  }
  if (_Var1 != 6) {
    LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x220,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_278 + 8),"Check failed: (m.find(\"D\")->second) == (6)",0x2a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
  }
  RE2::~RE2(&local_f8);
  return;
}

Assistant:

TEST(Capture, NamedGroups) {
  {
    RE2 re("(hello world)");
    CHECK_EQ(re.NumberOfCapturingGroups(), 1);
    const map<string, int>& m = re.NamedCapturingGroups();
    CHECK_EQ(m.size(), 0);
  }

  {
    RE2 re("(?P<A>expr(?P<B>expr)(?P<C>expr))((expr)(?P<D>expr))");
    CHECK_EQ(re.NumberOfCapturingGroups(), 6);
    const map<string, int>& m = re.NamedCapturingGroups();
    CHECK_EQ(m.size(), 4);
    CHECK_EQ(m.find("A")->second, 1);
    CHECK_EQ(m.find("B")->second, 2);
    CHECK_EQ(m.find("C")->second, 3);
    CHECK_EQ(m.find("D")->second, 6);  // $4 and $5 are anonymous
  }
}